

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::LRUCache::~LRUCache(LRUCache *this)

{
  long lVar1;
  HandleTable *in_RDI;
  long in_FS_OFFSET;
  LRUHandle *next;
  LRUHandle *e;
  LRUCache *e_00;
  LRUCache *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((HandleTable *)in_RDI[9].list_ != in_RDI + 8) {
    __assert_fail("in_use_.next == &in_use_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                  ,0xce,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
  }
  this_00 = *(LRUCache **)(in_RDI + 5);
  while( true ) {
    if (this_00 == (LRUCache *)&in_RDI[3].list_) {
      HandleTable::~HandleTable(in_RDI);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    e_00 = *(LRUCache **)((long)&(this_00->mutex_).mu_.super___mutex_base._M_mutex + 0x10);
    if (((ulong)(this_00->lru_).value & 1) == 0) break;
    *(undefined1 *)&(this_00->lru_).value = 0;
    if (*(int *)((long)&(this_00->lru_).value + 4) != 1) {
      __assert_fail("e->refs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                    ,0xd3,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
    }
    Unref(this_00,(LRUHandle *)e_00);
    this_00 = e_00;
  }
  __assert_fail("e->in_cache",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                ,0xd1,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
}

Assistant:

LRUCache::~LRUCache() {
  assert(in_use_.next == &in_use_);  // Error if caller has an unreleased handle
  for (LRUHandle* e = lru_.next; e != &lru_;) {
    LRUHandle* next = e->next;
    assert(e->in_cache);
    e->in_cache = false;
    assert(e->refs == 1);  // Invariant of lru_ list.
    Unref(e);
    e = next;
  }
}